

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O0

int __thiscall
JsUtil::List<Js::ReturnedValue_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
Add(List<Js::ReturnedValue_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this,
   ReturnedValue **item)

{
  int iVar1;
  ReturnedValue *ptr;
  WriteBarrierPtr<Js::ReturnedValue> **ppWVar2;
  int pos;
  ReturnedValue **item_local;
  List<Js::ReturnedValue_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_local;
  
  EnsureArray(this);
  ptr = *item;
  ppWVar2 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                      ((WriteBarrierPtr *)
                       &(this->
                        super_ReadOnlyList<Js::ReturnedValue_*,_Memory::Recycler,_DefaultComparer>).
                        buffer);
  Memory::WriteBarrierPtr<Js::ReturnedValue>::operator=
            (*ppWVar2 +
             (this->super_ReadOnlyList<Js::ReturnedValue_*,_Memory::Recycler,_DefaultComparer>).
             count,ptr);
  iVar1 = (this->super_ReadOnlyList<Js::ReturnedValue_*,_Memory::Recycler,_DefaultComparer>).count;
  (this->super_ReadOnlyList<Js::ReturnedValue_*,_Memory::Recycler,_DefaultComparer>).count =
       (this->super_ReadOnlyList<Js::ReturnedValue_*,_Memory::Recycler,_DefaultComparer>).count + 1;
  return iVar1;
}

Assistant:

int Add(const T& item)
        {
            EnsureArray();
            this->buffer[this->count] = item;
            int pos = this->count;
            this->count++;
            return pos;
        }